

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int band(lua_State *L)

{
  UB UVar1;
  undefined4 local_18;
  undefined4 local_14;
  UB b;
  int i;
  lua_State *L_local;
  
  local_18 = barg(L,1);
  for (local_14 = lua_gettop(L); 1 < local_14; local_14 = local_14 + -1) {
    UVar1 = barg(L,local_14);
    local_18 = UVar1 & local_18;
  }
  lua_pushnumber(L,(double)(int)local_18);
  return 1;
}

Assistant:

static int band(lua_State*L){
int i;UB b=barg(L,1);for(i=lua_gettop(L);i>1;i--)b&=barg(L,i);BRET(b)}